

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O2

void PrintJSONString(string *in)

{
  string out;
  
  EncodeJSONString(&out,in);
  fwrite(out._M_dataplus._M_p,1,out._M_string_length,_stdout);
  std::__cxx11::string::~string((string *)&out);
  return;
}

Assistant:

void PrintJSONString(const std::string& in) {
  std::string out = EncodeJSONString(in);
  fwrite(out.c_str(), 1, out.length(), stdout);
}